

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GenerateAccessorDeclarations
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  FieldOptions_CType FVar1;
  FieldOptions *pFVar2;
  Printer *printer_local;
  RepeatedStringFieldGenerator *this_local;
  
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  FVar1 = FieldOptions::ctype(pFVar2);
  if (FVar1 != FieldOptions_CType_STRING) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer," private:\n  // Hidden due to unknown ctype option.\n");
    io::Printer::Indent(printer);
  }
  io::Printer::Print(printer,&this->variables_,
                     "inline const ::std::string& $name$(int index) const$deprecation$;\ninline ::std::string* mutable_$name$(int index)$deprecation$;\ninline void set_$name$(int index, const ::std::string& value)$deprecation$;\ninline void set_$name$(int index, const char* value)$deprecation$;\ninline void set_$name$(int index, const $pointer_type$* value, size_t size)$deprecation$;\ninline ::std::string* add_$name$()$deprecation$;\ninline void add_$name$(const ::std::string& value)$deprecation$;\ninline void add_$name$(const char* value)$deprecation$;\ninline void add_$name$(const $pointer_type$* value, size_t size)$deprecation$;\n"
                    );
  io::Printer::Print(printer,&this->variables_,
                     "inline const ::google::protobuf::RepeatedPtrField< ::std::string>& $name$() const$deprecation$;\ninline ::google::protobuf::RepeatedPtrField< ::std::string>* mutable_$name$()$deprecation$;\n"
                    );
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  FVar1 = FieldOptions::ctype(pFVar2);
  if (FVar1 != FieldOptions_CType_STRING) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer," public:\n");
    io::Printer::Indent(printer);
  }
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateAccessorDeclarations(io::Printer* printer) const {
  // See comment above about unknown ctypes.
  if (descriptor_->options().ctype() != FieldOptions::STRING) {
    printer->Outdent();
    printer->Print(
      " private:\n"
      "  // Hidden due to unknown ctype option.\n");
    printer->Indent();
  }

  printer->Print(variables_,
    "inline const ::std::string& $name$(int index) const$deprecation$;\n"
    "inline ::std::string* mutable_$name$(int index)$deprecation$;\n"
    "inline void set_$name$(int index, const ::std::string& value)$deprecation$;\n"
    "inline void set_$name$(int index, const char* value)$deprecation$;\n"
    "inline "
    "void set_$name$(int index, const $pointer_type$* value, size_t size)"
                 "$deprecation$;\n"
    "inline ::std::string* add_$name$()$deprecation$;\n"
    "inline void add_$name$(const ::std::string& value)$deprecation$;\n"
    "inline void add_$name$(const char* value)$deprecation$;\n"
    "inline void add_$name$(const $pointer_type$* value, size_t size)"
                 "$deprecation$;\n");

  printer->Print(variables_,
    "inline const ::google::protobuf::RepeatedPtrField< ::std::string>& $name$() const"
                 "$deprecation$;\n"
    "inline ::google::protobuf::RepeatedPtrField< ::std::string>* mutable_$name$()"
                 "$deprecation$;\n");

  if (descriptor_->options().ctype() != FieldOptions::STRING) {
    printer->Outdent();
    printer->Print(" public:\n");
    printer->Indent();
  }
}